

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TabItemLabelAndCloseButton
               (ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,char *label,ImGuiID tab_id,
               ImGuiID close_button_id)

{
  ImVec2 IVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  undefined8 text_end;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ImU32 col;
  char *text_display_end;
  float fVar7;
  float fVar8;
  float fVar9;
  float local_c8;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImDrawList *local_a8;
  float local_9c;
  ImVec2 local_98;
  ImVec2 label_size;
  float local_88;
  ImGuiItemHoveredDataBackup last_item_backup;
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  bVar4 = false;
  local_a8 = draw_list;
  label_size = CalcTextSize(label,(char *)0x0,true,-1.0);
  fVar9 = (bb->Min).x;
  local_c8 = (bb->Max).x;
  if (1.0 < local_c8 - fVar9) {
    local_b0.y = (bb->Max).y;
    IVar1 = (pIVar3->Style).FramePadding;
    fVar7 = IVar1.x;
    fVar9 = fVar9 + fVar7;
    local_c8 = local_c8 - fVar7;
    local_b8.y = (bb->Min).y + IVar1.y;
    local_b8.x = fVar9;
    local_88 = label_size.x;
    local_b0.x = local_c8;
    if ((flags & 1U) != 0) {
      IVar1 = CalcTextSize("*",(char *)0x0,false,-1.0);
      local_c8 = local_c8 - IVar1.x;
      IVar1 = (pIVar3->Style).FramePadding;
      fVar7 = IVar1.x;
      fVar8 = IVar1.y;
      last_item_backup.LastItemId = (ImGuiID)((bb->Min).x + fVar7 + local_88 + 2.0);
      if (local_c8 <= (float)last_item_backup.LastItemId) {
        last_item_backup.LastItemId = (ImGuiID)local_c8;
      }
      last_item_backup.LastItemStatusFlags =
           (ImGuiItemStatusFlags)(fVar8 + (bb->Min).y + (float)(int)(pIVar3->FontSize * -0.25));
      local_98.y = (bb->Max).y - fVar8;
      local_98.x = (bb->Max).x - fVar7;
      local_38.x = 0.0;
      local_38.y = 0.0;
      local_b0.x = local_c8;
      RenderTextClippedEx(local_a8,(ImVec2 *)&last_item_backup,&local_98,"*",(char *)0x0,
                          (ImVec2 *)0x0,&local_38,(ImRect *)0x0);
    }
    if ((close_button_id == 0) ||
       ((pIVar3->HoveredId != close_button_id && pIVar3->HoveredId != tab_id &&
        (pIVar3->ActiveId != close_button_id)))) {
      bVar5 = false;
      bVar4 = false;
    }
    else {
      ImGuiItemHoveredDataBackup::ImGuiItemHoveredDataBackup(&last_item_backup);
      local_9c = pIVar3->FontSize * 0.5;
      local_98.y = (bb->Min).y + (pIVar3->Style).FramePadding.y + local_9c;
      local_98.x = ((bb->Max).x - (pIVar3->Style).FramePadding.x) - local_9c;
      bVar4 = CloseButton(close_button_id,&local_98,local_9c);
      pIVar2 = GImGui->CurrentWindow;
      (pIVar2->DC).LastItemId = last_item_backup.LastItemId;
      (pIVar2->DC).LastItemStatusFlags = last_item_backup.LastItemStatusFlags;
      (pIVar2->DC).LastItemRect.Min = last_item_backup.LastItemRect.Min;
      (pIVar2->DC).LastItemRect.Max = last_item_backup.LastItemRect.Max;
      (pIVar2->DC).LastItemDisplayRect.Min = last_item_backup.LastItemDisplayRect.Min;
      (pIVar2->DC).LastItemDisplayRect.Max = last_item_backup.LastItemDisplayRect.Max;
      if ((flags & 4U) == 0) {
        bVar5 = IsMouseClicked(2,false);
        bVar4 = bVar4 || bVar5;
      }
      local_b0.x = local_c8 - (local_9c + local_9c);
      bVar5 = true;
    }
    text_display_end = FindRenderedTextEnd(label,(char *)0x0);
    local_c8 = local_c8 - fVar9;
    if (local_88 <= local_c8) {
      last_item_backup.LastItemId = 0;
      last_item_backup.LastItemStatusFlags = 0;
      RenderTextClippedEx(local_a8,&local_b8,&local_b0,label,text_display_end,&label_size,
                          (ImVec2 *)&last_item_backup,(ImRect *)0x0);
    }
    else {
      last_item_backup.LastItemId = 0;
      last_item_backup.LastItemStatusFlags = 0;
      IVar1 = ImFont::CalcTextSizeA
                        (pIVar3->Font,pIVar3->FontSize,local_c8 + -5.0 + 1.0,0.0,label,
                         text_display_end,(char **)&last_item_backup);
      local_c8 = IVar1.x;
      if ((ulong)last_item_backup._0_8_ < text_display_end &&
          (char *)last_item_backup._0_8_ == label) {
        iVar6 = ImTextCountUtf8BytesFromChar(label,text_display_end);
        last_item_backup._0_8_ = label + iVar6;
        IVar1 = ImFont::CalcTextSizeA
                          (pIVar3->Font,pIVar3->FontSize,3.4028235e+38,0.0,label,
                           (char *)last_item_backup._0_8_,(char **)0x0);
        local_c8 = IVar1.x;
      }
      while ((text_end = last_item_backup._0_8_, label < (ulong)last_item_backup._0_8_ &&
             ((*(char *)(last_item_backup._0_8_ + -1) == ' ' ||
              (*(char *)(last_item_backup._0_8_ + -1) == '\t'))))) {
        last_item_backup._0_8_ = last_item_backup._0_8_ + -1;
        IVar1 = ImFont::CalcTextSizeA
                          (pIVar3->Font,pIVar3->FontSize,3.4028235e+38,0.0,
                           (char *)last_item_backup._0_8_,(char *)text_end,(char **)0x0);
        local_c8 = local_c8 - IVar1.x;
      }
      local_98.x = 0.0;
      local_98.y = 0.0;
      RenderTextClippedEx(local_a8,&local_b8,&local_b0,label,(char *)last_item_backup._0_8_,
                          &label_size,&local_98,(ImRect *)0x0);
      if (!bVar5) {
        fVar9 = local_c8 + local_b8.x + 1.0;
        if (fVar9 + 5.0 <= (bb->Max).x) {
          fVar7 = local_b8.y;
          col = GetColorU32(0,1.0);
          IVar1.y = fVar7;
          IVar1.x = fVar9;
          RenderPixelEllipsis(local_a8,IVar1,3,col);
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool ImGui::TabItemLabelAndCloseButton(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, const char* label, ImGuiID tab_id, ImGuiID close_button_id)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (bb.GetWidth() <= 1.0f)
        return false;

    // Render text label (with clipping + alpha gradient) + unsaved marker
    const char* TAB_UNSAVED_MARKER = "*";
    ImRect text_pixel_clip_bb(bb.Min.x + style.FramePadding.x, bb.Min.y + style.FramePadding.y, bb.Max.x - style.FramePadding.x, bb.Max.y);
    if (flags & ImGuiTabItemFlags_UnsavedDocument)
    {
        text_pixel_clip_bb.Max.x -= CalcTextSize(TAB_UNSAVED_MARKER, NULL, false).x;
        ImVec2 unsaved_marker_pos(ImMin(bb.Min.x + style.FramePadding.x + label_size.x + 2, text_pixel_clip_bb.Max.x), bb.Min.y + style.FramePadding.y + (float)(int)(-g.FontSize * 0.25f));
        RenderTextClippedEx(draw_list, unsaved_marker_pos, bb.Max - style.FramePadding, TAB_UNSAVED_MARKER, NULL, NULL);
    }
    ImRect text_ellipsis_clip_bb = text_pixel_clip_bb;

    // Close Button
    // We are relying on a subtle and confusing distinction between 'hovered' and 'g.HoveredId' which happens because we are using ImGuiButtonFlags_AllowOverlapMode + SetItemAllowOverlap()
    //  'hovered' will be true when hovering the Tab but NOT when hovering the close button
    //  'g.HoveredId==id' will be true when hovering the Tab including when hovering the close button
    //  'g.ActiveId==close_button_id' will be true when we are holding on the close button, in which case both hovered booleans are false
    bool close_button_pressed = false;
    bool close_button_visible = false;
    if (close_button_id != 0)
        if (g.HoveredId == tab_id || g.HoveredId == close_button_id || g.ActiveId == close_button_id)
            close_button_visible = true;
    if (close_button_visible)
    {
        ImGuiItemHoveredDataBackup last_item_backup;
        const float close_button_sz = g.FontSize * 0.5f;
        if (CloseButton(close_button_id, ImVec2(bb.Max.x - style.FramePadding.x - close_button_sz, bb.Min.y + style.FramePadding.y + close_button_sz), close_button_sz))
            close_button_pressed = true;
        last_item_backup.Restore();

        // Close with middle mouse button
        if (!(flags & ImGuiTabItemFlags_NoCloseWithMiddleMouseButton) && IsMouseClicked(2))
            close_button_pressed = true;

        text_pixel_clip_bb.Max.x -= close_button_sz * 2.0f;
    }

    // Label with ellipsis
    // FIXME: This should be extracted into a helper but the use of text_pixel_clip_bb and !close_button_visible makes it tricky to abstract at the moment
    const char* label_display_end = FindRenderedTextEnd(label);
    if (label_size.x > text_ellipsis_clip_bb.GetWidth())
    {
        const int ellipsis_dot_count = 3;
        const float ellipsis_width = (1.0f + 1.0f) * ellipsis_dot_count - 1.0f;
        const char* label_end = NULL;
        float label_size_clipped_x = g.Font->CalcTextSizeA(g.FontSize, text_ellipsis_clip_bb.GetWidth() - ellipsis_width + 1.0f, 0.0f, label, label_display_end, &label_end).x;
        if (label_end == label && label_end < label_display_end)    // Always display at least 1 character if there's no room for character + ellipsis
        {
            label_end = label + ImTextCountUtf8BytesFromChar(label, label_display_end);
            label_size_clipped_x = g.Font->CalcTextSizeA(g.FontSize, FLT_MAX, 0.0f, label, label_end).x;
        }
        while (label_end > label && ImCharIsBlankA(label_end[-1])) // Trim trailing space
        {
            label_end--;
            label_size_clipped_x -= g.Font->CalcTextSizeA(g.FontSize, FLT_MAX, 0.0f, label_end, label_end + 1).x; // Ascii blanks are always 1 byte
        }
        RenderTextClippedEx(draw_list, text_pixel_clip_bb.Min, text_pixel_clip_bb.Max, label, label_end, &label_size, ImVec2(0.0f, 0.0f));

        const float ellipsis_x = text_pixel_clip_bb.Min.x + label_size_clipped_x + 1.0f;
        if (!close_button_visible && ellipsis_x + ellipsis_width <= bb.Max.x)
            RenderPixelEllipsis(draw_list, ImVec2(ellipsis_x, text_pixel_clip_bb.Min.y), ellipsis_dot_count, GetColorU32(ImGuiCol_Text));
    }
    else
    {
        RenderTextClippedEx(draw_list, text_pixel_clip_bb.Min, text_pixel_clip_bb.Max, label, label_display_end, &label_size, ImVec2(0.0f, 0.0f));
    }

    return close_button_pressed;
}